

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O3

void __thiscall
draco::PointCloud::ApplyPointIdDeduplication
          (PointCloud *this,
          IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
          *id_map,vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                  *unique_point_ids)

{
  uint uVar1;
  uint uVar2;
  pointer pIVar3;
  pointer pIVar4;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var5;
  pointer puVar6;
  uint uVar7;
  pointer pIVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  size_type __new_size;
  
  pIVar8 = (unique_point_ids->
           super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar3 = (unique_point_ids->
           super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar8 == pIVar3) {
    puVar6 = (this->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (uint)((ulong)((long)(this->attributes_).
                                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6) >> 3);
    __new_size = 0;
  }
  else {
    pIVar4 = (id_map->vector_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (this->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (uint)((ulong)((long)(this->attributes_).
                                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6) >> 3);
    uVar9 = 0;
    do {
      uVar1 = pIVar8->value_;
      uVar2 = pIVar4[uVar1].value_;
      if (uVar9 <= uVar2) {
        if (0 < (int)uVar7) {
          uVar10 = 0;
          do {
            _Var5._M_t.
            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
                 puVar6[uVar10]._M_t.
                 super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                 ._M_t;
            lVar11 = *(long *)((long)_Var5._M_t.
                                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                     _M_head_impl + 0x48);
            uVar9 = uVar1;
            if (*(char *)((long)_Var5._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                         + 100) == '\0') {
              uVar9 = *(uint *)(lVar11 + (ulong)uVar1 * 4);
            }
            *(uint *)(lVar11 + (ulong)uVar2 * 4) = uVar9;
            uVar10 = uVar10 + 1;
          } while ((uVar7 & 0x7fffffff) != uVar10);
        }
        uVar9 = uVar2 + 1;
      }
      pIVar8 = pIVar8 + 1;
    } while (pIVar8 != pIVar3);
    __new_size = (size_type)(int)uVar9;
  }
  if (0 < (int)uVar7) {
    lVar11 = 0;
    do {
      _Var5._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           puVar6[lVar11]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      *(undefined1 *)
       ((long)_Var5._M_t.
              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 100) = 0;
      std::
      vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ::resize((vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                *)((long)_Var5._M_t.
                         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                         .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x48)
               ,__new_size,(value_type *)&kInvalidAttributeValueIndex);
      lVar11 = lVar11 + 1;
      puVar6 = (this->attributes_).
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar11 < (int)((ulong)((long)(this->attributes_).
                                          super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6)
                           >> 3));
  }
  return;
}

Assistant:

void PointCloud::ApplyPointIdDeduplication(
    const IndexTypeVector<PointIndex, PointIndex> &id_map,
    const std::vector<PointIndex> &unique_point_ids) {
  int32_t num_unique_points = 0;
  for (PointIndex i : unique_point_ids) {
    const PointIndex new_point_id = id_map[i];
    if (new_point_id >= num_unique_points) {
      // New unique vertex reached. Copy attribute indices to the proper
      // position.
      for (int32_t a = 0; a < num_attributes(); ++a) {
        attribute(a)->SetPointMapEntry(new_point_id,
                                       attribute(a)->mapped_index(i));
      }
      num_unique_points = new_point_id.value() + 1;
    }
  }
  for (int32_t a = 0; a < num_attributes(); ++a) {
    attribute(a)->SetExplicitMapping(num_unique_points);
  }
}